

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-definition-parse.c
# Opt level: O0

int type_set_bit_size(parser_info *info)

{
  int iVar1;
  parser_info *info_local;
  
  if (info->node->data == (void *)0x0) {
    iVar1 = coda_type_set_bit_size((coda_type *)info->node->parent->data,info->node->integer_data);
    if (iVar1 != 0) {
      return -1;
    }
  }
  else {
    iVar1 = coda_type_set_bit_size_expression
                      ((coda_type *)info->node->parent->data,(coda_expression *)info->node->data);
    if (iVar1 != 0) {
      return -1;
    }
    info->node->data = (void *)0x0;
  }
  return 0;
}

Assistant:

static int type_set_bit_size(parser_info *info)
{
    if (info->node->data != NULL)
    {
        if (coda_type_set_bit_size_expression((coda_type *)info->node->parent->data,
                                              (coda_expression *)info->node->data) != 0)
        {
            return -1;
        }
        info->node->data = NULL;
    }
    else
    {
        if (coda_type_set_bit_size((coda_type *)info->node->parent->data, (long)info->node->integer_data) != 0)
        {
            return -1;
        }
    }
    return 0;
}